

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

object_ptr __thiscall
mjs::interpreter::impl::create_function(impl *this,function_base *f,scope_ptr *prev_scope)

{
  uint uVar1;
  undefined8 extraout_RDX;
  object_ptr oVar2;
  allocator<wchar_t> local_71;
  gc_heap_ptr_untyped local_70;
  scope_ptr local_60 [2];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_40;
  wstring_view local_30;
  
  local_30._M_str = *(wchar_t **)&prev_scope[1].super_gc_heap_ptr_untyped.pos_;
  local_30._M_len = (size_t)prev_scope[2].super_gc_heap_ptr_untyped.heap_;
  string::string((string *)&local_70,
                 (gc_heap *)
                 (f->body_extend_).file.
                 super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_30);
  uVar1 = *(uint *)&prev_scope[1].super_gc_heap_ptr_untyped.heap_;
  local_40._M_str =
       (wchar_t *)
       ((ulong)uVar1 * 4 + *(long *)&((prev_scope->super_gc_heap_ptr_untyped).heap_)->owns_storage_)
  ;
  local_40._M_len =
       (size_t)(*(int *)((long)&prev_scope[1].super_gc_heap_ptr_untyped.heap_ + 4) - uVar1);
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)local_60,&local_40,&local_71);
  create_function(this,(string *)f,(shared_ptr<mjs::block_statement> *)&local_70,
                  (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)(prev_scope + 5),(wstring *)&prev_scope[3].super_gc_heap_ptr_untyped.pos_,
                  local_60);
  std::__cxx11::wstring::~wstring((wstring *)local_60);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
  oVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar2.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr create_function(const function_base& f, const scope_ptr& prev_scope) {
        return create_function(string{heap_, f.id()}, f.block_ptr(), f.params(), std::wstring{f.body_extend().source_view()}, prev_scope);
    }